

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O2

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::operator+=(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,work_t s)

{
  int d;
  long lVar1;
  long k;
  long lVar2;
  long lVar3;
  int iVar4;
  
  for (lVar1 = 0; lVar1 < image->depth; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 < image->height; lVar2 = lVar2 + 1) {
      for (lVar3 = 0; lVar3 < image->width; lVar3 = lVar3 + 1) {
        iVar4 = (uint)image->img[lVar1][lVar2][lVar3] + s;
        if (0xfe < iVar4) {
          iVar4 = 0xff;
        }
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        image->img[lVar1][lVar2][lVar3] = (uchar)iVar4;
      }
    }
  }
  return image;
}

Assistant:

Image<T> &operator+=(Image<T> &image, typename Image<T>::work_t s)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=0;

        v=image.get(i, k, d);

        if (image.isValidS(v))
        {
          image.setLimited(i, k, d, v+s);
        }
      }
    }
  }

  return image;
}